

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelSimulationDataGenerator.cpp
# Opt level: O0

U32 __thiscall
SimpleParallelSimulationDataGenerator::GenerateSimulationData
          (SimpleParallelSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  U32 UVar1;
  ulong uVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference ppSVar6;
  SimulationChannelDescriptor *pSVar7;
  uint local_38;
  U32 i;
  U32 count;
  U64 adjusted_largest_sample_requested;
  SimulationChannelDescriptor **simulation_channel_local;
  U32 sample_rate_local;
  U64 largest_sample_requested_local;
  SimpleParallelSimulationDataGenerator *this_local;
  
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar2 <= uVar3) break;
    SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x10);
    sVar4 = std::
            vector<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>::
            size(&this->mData);
    for (local_38 = 0; local_38 < (uint)sVar4; local_38 = local_38 + 1) {
      pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&this->mDataMasks,(ulong)local_38);
      if ((*pvVar5 & this->mValue) == 0) {
        ppSVar6 = std::
                  vector<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
                  ::operator[](&this->mData,(ulong)local_38);
        SimulationChannelDescriptor::TransitionIfNeeded((BitState)*ppSVar6);
      }
      else {
        ppSVar6 = std::
                  vector<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
                  ::operator[](&this->mData,(ulong)local_38);
        SimulationChannelDescriptor::TransitionIfNeeded((BitState)*ppSVar6);
      }
    }
    if (this->mSettings->mClockEdge != DualEdge) {
      SimulationChannelDescriptor::Transition();
    }
    SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x10);
    SimulationChannelDescriptor::Transition();
    this->mValue = this->mValue + 1;
  }
  pSVar7 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channel = pSVar7;
  UVar1 = SimulationChannelDescriptorGroup::GetCount();
  return UVar1;
}

Assistant:

U32 SimpleParallelSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                                   SimulationChannelDescriptor** simulation_channel )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mClock->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        mSimulationData.AdvanceAll( 1000 );
        U32 count = mData.size();
        for( U32 i = 0; i < count; i++ )
        {
            if( ( mDataMasks[ i ] & mValue ) == 0 )
                mData[ i ]->TransitionIfNeeded( BIT_LOW );
            else
                mData[ i ]->TransitionIfNeeded( BIT_HIGH );
        }
        if( mSettings->mClockEdge != ParallelAnalyzerClockEdge::DualEdge )
        {
            mClock->Transition();
        }

        mSimulationData.AdvanceAll( 1000 );
        mClock->Transition();

        mValue++;
    }

    *simulation_channel = mSimulationData.GetArray();
    return mSimulationData.GetCount();
}